

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XmlTestReporter.cpp
# Opt level: O0

string * anon_unknown.dwarf_5b4b6::BuildFailureMessage
                   (string *__return_storage_ptr__,string *file,int line,string *message)

{
  ostream *poVar1;
  ostringstream local_1a0 [8];
  ostringstream failureMessage;
  string *message_local;
  int line_local;
  string *file_local;
  
  failureMessage._368_8_ = message;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,(string *)file);
  poVar1 = std::operator<<(poVar1,"(");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,line);
  poVar1 = std::operator<<(poVar1,") : ");
  std::operator<<(poVar1,(string *)failureMessage._368_8_);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

string BuildFailureMessage(string const& file, int line, string const& message)
{
    ostringstream failureMessage;
    failureMessage << file << "(" << line << ") : " << message;
    return failureMessage.str();
}